

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall chrono::ChSharedMassBody::ArchiveIN(ChSharedMassBody *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChSharedMassBody>(marchive);
  local_28._value = &this->mass;
  local_28._name = "mass";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  this->inv_mass = 1.0 / this->mass;
  return;
}

Assistant:

void ChSharedMassBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSharedMassBody>();

    // stream in all member data:
    marchive >> CHNVP(mass);
    ////marchive >> CHNVP(inertia);
    SetBodyMass(mass);
    ////SetBodyInertia(inertia);
}